

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O0

vector_type * __thiscall
Disa::Vector_Dense<double,0ul>::operator-=
          (Vector_Dense<double,0ul> *this,Vector_Dense<double,_3UL> *vector)

{
  double dVar1;
  source_location *psVar2;
  source_location *location;
  ostream *poVar3;
  size_type sVar4;
  const_reference pvVar5;
  reference pvVar6;
  ulong local_118;
  size_type index;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  array<double,_3UL> *local_18;
  Vector_Dense<double,_3UL> *vector_local;
  Vector_Dense<double,_0UL> *this_local;
  
  local_18 = &vector->super_array<double,_3UL>;
  vector_local = (Vector_Dense<double,_3UL> *)this;
  psVar2 = (source_location *)
           std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)this);
  location = (source_location *)std::array<double,_3UL>::size(local_18);
  if (psVar2 != location) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"\n");
    local_40 = &PTR_s__workspace_llm4binary_github_lic_001b63c0;
    console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,location);
    poVar3 = std::operator<<(poVar3,(string *)&local_38);
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)this);
    std::__cxx11::to_string(&local_f0,sVar4);
    std::operator+(&local_d0,"Incompatible vector sizes, ",&local_f0);
    std::operator+(&local_b0,&local_d0," vs. ");
    sVar4 = std::array<double,_3UL>::size(local_18);
    std::__cxx11::to_string((string *)&index,sVar4);
    std::operator+(&local_90,&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&index);
    std::operator+(&local_70,&local_90,".");
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&index);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_38);
    exit(1);
  }
  local_118 = 0;
  while( true ) {
    sVar4 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)this);
    if (sVar4 <= local_118) break;
    pvVar5 = std::array<double,_3UL>::operator[](local_18,local_118);
    dVar1 = *pvVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)this,local_118);
    *pvVar6 = *pvVar6 - dVar1;
    local_118 = local_118 + 1;
  }
  return (vector_type *)this;
}

Assistant:

constexpr vector_type& operator-=(const Vector_Dense<_type, _size_other>& vector) {
    ASSERT_DEBUG(this->size() == vector.size(), "Incompatible vector sizes, " + std::to_string(this->size()) + " vs. " +
                                                std::to_string(vector.size()) + ".");
    FOR(index, this->size())(*this)[index] -= vector[index];
    return *this;
  }